

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O2

void __thiscall iutest::TempFile::Close(TempFile *this)

{
  StdioFile::Close(&this->m_file);
  if (this->m_fd != -1) {
    close(this->m_fd);
    this->m_fd = -1;
  }
  return;
}

Assistant:

virtual void Close() IUTEST_CXX_OVERRIDE
    {
        m_file.Close();
        if( m_fd != -1 )
        {
            internal::posix::FdClose(m_fd);
            m_fd = -1;
        }
    }